

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O1

bool test_Player_reinforce(bool verbose)

{
  pointer ppPVar1;
  Hand *pHVar2;
  vector<CardType,_std::allocator<CardType>_> *pvVar3;
  iterator iVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  pointer ppCVar6;
  Country *pCVar7;
  pointer pcVar8;
  GameLoop *pGVar9;
  ostream *poVar10;
  pointer ppCVar11;
  bool bVar12;
  long *local_58;
  long local_50;
  long local_48 [2];
  int local_38;
  int local_34;
  
  GameLoop::startSingle(true);
  pGVar9 = GameLoop::getInstance();
  ppPVar1 = (pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    pHVar2 = (*ppPVar1)->pCards;
    pvVar3 = pHVar2->handPointer;
    local_58._0_4_ = 2;
    iVar4._M_current =
         (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (pvVar3,iVar4,(CardType *)&local_58);
    }
    else {
      *iVar4._M_current = CAVALRY;
      (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pvVar3 = pHVar2->handPointer;
    local_58._0_4_ = 2;
    iVar4._M_current =
         (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (pvVar3,iVar4,(CardType *)&local_58);
    }
    else {
      *iVar4._M_current = CAVALRY;
      (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pvVar3 = pHVar2->handPointer;
    local_58._0_4_ = 2;
    iVar4._M_current =
         (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (pvVar3,iVar4,(CardType *)&local_58);
    }
    else {
      *iVar4._M_current = CAVALRY;
      (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pvVar3 = pHVar2->handPointer;
    local_58._0_4_ = 2;
    iVar4._M_current =
         (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (pvVar3,iVar4,(CardType *)&local_58);
    }
    else {
      *iVar4._M_current = CAVALRY;
      (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pvVar3 = pHVar2->handPointer;
    local_58 = (long *)CONCAT44(local_58._4_4_,2);
    iVar4._M_current =
         (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (pvVar3,iVar4,(CardType *)&local_58);
    }
    else {
      *iVar4._M_current = CAVALRY;
      (pvVar3->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pGVar9 = GameLoop::getInstance();
    ppPVar1 = (pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppPVar1) {
      pvVar5 = (*ppPVar1)->pOwnedCountries;
      ppCVar11 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppCVar11) {
        local_34 = *(*ppCVar11)->pNumberOfTroops;
        pGVar9 = GameLoop::getInstance();
        ppPVar1 = (pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppPVar1) {
          local_38 = Player::reinforce(*ppPVar1);
          if (verbose) {
            pGVar9 = GameLoop::getInstance();
            ppPVar1 = (pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pGVar9->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                _M_impl.super__Vector_impl_data._M_finish == ppPVar1) goto LAB_0010a1c5;
            pvVar5 = (*ppPVar1)->pOwnedCountries;
            ppCVar11 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar6 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar11 != ppCVar6) {
              do {
                pCVar7 = *ppCVar11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\x1b[35m",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"player1\'s ",10);
                pcVar8 = (pCVar7->cyName->_M_dataplus)._M_p;
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,pcVar8,pcVar8 + pCVar7->cyName->_M_string_length);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_58,local_50);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," had ",5);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_34);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                if (local_58 != local_48) {
                  operator_delete(local_58,local_48[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"player1\'s ",10);
                pcVar8 = (pCVar7->cyName->_M_dataplus)._M_p;
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,pcVar8,pcVar8 + pCVar7->cyName->_M_string_length);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_58,local_50);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," now has ",9);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pCVar7->pNumberOfTroops);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                if (local_58 != local_48) {
                  operator_delete(local_58,local_48[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\x1b[31m",5);
                ppCVar11 = ppCVar11 + 1;
              } while (ppCVar11 != ppCVar6);
            }
          }
          bVar12 = local_38 != -1;
          GameLoop::resetInstance();
          return bVar12;
        }
      }
    }
  }
LAB_0010a1c5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

bool test_Player_reinforce(bool verbose = false) {

    // Arrange
    bool success = true;
    GameLoop::startSingle(true);
    Hand* pHand = GameLoop::getInstance()->getAllPlayers()->at(0)->getCards();
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->reinforce() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        for (auto* c: *GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()) {
            std::cout << "\033[35m";
            std::cout << "player1's " << c->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
            std::cout << "player1's " << c->getCountryName() << " now has " << c->getNumberOfTroops()
                      << " armies" << std::endl;
            std::cout << "\033[31m";
        }
    }
    GameLoop::resetInstance();
    return success;
}